

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O0

IHEVCD_ERROR_T ihevcd_parse_sps(codec_t *ps_codec)

{
  long lVar1;
  undefined1 uVar2;
  int iVar3;
  int sps_max_sub_layers_minus1;
  int iVar4;
  bitstrm_t *ps_bitstrm_00;
  int *in_RDI;
  WORD32 ref_strd;
  WORD32 crop_unit_y;
  WORD32 crop_unit_x;
  WORD32 disp_ht;
  WORD32 disp_wd;
  WORD32 ceil_offset;
  WORD32 numerator;
  WORD32 scaling_mat_offset_1 [20];
  WORD32 scaling_mat_offset [20];
  sps_t *ps_sps_old;
  WORD32 ctb_log2_size_y;
  bitstrm_t *ps_bitstrm;
  profile_tier_lvl_info_t s_ptl;
  sps_t *ps_sps;
  WORD32 sps_temporal_id_nesting_flag;
  WORD32 sps_id;
  WORD32 sps_max_sub_layers;
  WORD32 vps_id;
  WORD32 i;
  WORD32 value;
  IHEVCD_ERROR_T ret;
  int local_290;
  WORD32 in_stack_fffffffffffffd78;
  int iVar5;
  int in_stack_fffffffffffffd7c;
  UWORD32 in_stack_fffffffffffffd84;
  UWORD32 UVar6;
  undefined4 in_stack_fffffffffffffd8c;
  int local_270;
  int local_26c;
  undefined1 local_258 [24];
  int local_240;
  int local_228;
  int local_21c;
  int local_210;
  int local_20c;
  stref_picset_t *in_stack_fffffffffffffdf8;
  WORD32 in_stack_fffffffffffffe00;
  WORD32 in_stack_fffffffffffffe04;
  stref_picset_t *in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  undefined1 local_19b [355];
  short *local_38;
  UWORD32 local_2c;
  UWORD32 local_28;
  int local_24;
  UWORD32 local_20;
  int local_1c;
  UWORD32 local_18;
  IHEVCD_ERROR_T local_14;
  int *local_10;
  IHEVCD_ERROR_T local_4;
  
  local_14 = 0;
  ps_bitstrm_00 = (bitstrm_t *)(in_RDI + 0x86);
  local_10 = in_RDI;
  local_18 = ihevcd_bits_get(ps_bitstrm_00,4);
  if ((int)local_18 < 0x10) {
    in_stack_fffffffffffffd84 = local_18;
    UVar6 = local_18;
    if ((int)local_18 < 0) {
      in_stack_fffffffffffffd84 = 0;
      UVar6 = 0;
    }
  }
  else {
    UVar6 = 0xf;
  }
  local_20 = UVar6;
  local_18 = ihevcd_bits_get(ps_bitstrm_00,3);
  iVar3 = local_18 + 1;
  if (iVar3 < 8) {
    iVar4 = iVar3;
    if (iVar3 < 1) {
      iVar3 = 1;
      iVar4 = iVar3;
    }
  }
  else {
    iVar3 = in_stack_fffffffffffffd7c;
    iVar4 = 7;
  }
  local_24 = iVar4;
  local_2c = ihevcd_bits_get(ps_bitstrm_00,1);
  local_18 = local_2c;
  local_14 = ihevcd_profile_tier_level
                       ((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd8c,UVar6),
                        (profile_tier_lvl_info_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4),iVar3,
                        in_stack_fffffffffffffd78);
  local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
  if ((0x10 < (int)local_18) || (local_28 = local_18, (int)local_18 < 0)) {
    if (local_10[0x1c] != 0) {
      return IHEVCD_UNSUPPORTED_SPS_ID;
    }
    local_28 = 0;
  }
  lVar1 = *(long *)(local_10 + 0xe2);
  local_38 = (short *)(lVar1 + 0x20c80);
  *(char *)(lVar1 + 0x20c8c) = (char)local_28;
  *(char *)(lVar1 + 0x20c8d) = (char)local_20;
  *(char *)(lVar1 + 0x20c8e) = (char)local_24;
  *(char *)(lVar1 + 0x20cbb) = (char)local_2c;
  local_10[0xfcc] = local_28;
  memcpy((void *)(lVar1 + 0x21a50),local_19b,0x163);
  local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
  *(char *)((long)local_38 + 0xf) = (char)local_18;
  if (*(char *)((long)local_38 + 0xf) == '\x01') {
    if (*(char *)((long)local_38 + 0xf) == '\x04') {
      local_18 = ihevcd_bits_get(ps_bitstrm_00,1);
      *(char *)(local_38 + 9) = (char)local_18;
    }
    else {
      *(undefined1 *)(local_38 + 9) = 0;
    }
    local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
    *local_38 = (short)local_18;
    local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
    local_38[1] = (short)local_18;
    if ((*local_38 < 1) || (local_38[1] < 1)) {
      local_4 = IHEVCD_INVALID_PARAMETER;
    }
    else {
      *local_38 = (short)((*local_38 + 7 >> 3) << 3);
      local_38[1] = (short)((local_38[1] + 7 >> 3) << 3);
      local_18 = ihevcd_bits_get(ps_bitstrm_00,1);
      *(char *)((long)local_38 + 0x13) = (char)local_18;
      if (*(char *)((long)local_38 + 0x13) == '\0') {
        local_38[2] = 0;
        local_38[3] = 0;
        local_38[4] = 0;
        local_38[5] = 0;
      }
      else {
        local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
        local_38[2] = (short)local_18;
        local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
        local_38[3] = (short)local_18;
        local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
        local_38[4] = (short)local_18;
        local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
        local_38[5] = (short)local_18;
      }
      local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
      if (local_18 == 0) {
        local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
        if (local_18 == 0) {
          local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
          *(char *)((long)local_38 + 0x17) = (char)local_18 + '\x04';
          local_18 = ihevcd_bits_get(ps_bitstrm_00,1);
          *(char *)(local_38 + 0xc) = (char)local_18;
          if ((char)local_38[0xc] == '\0') {
            iVar5 = (char)local_38[7] + -1;
            local_1c = iVar5;
          }
          else {
            iVar5 = 0;
            local_1c = iVar5;
          }
          for (; local_1c < (char)local_38[7]; local_1c = local_1c + 1) {
            local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
            *(char *)((long)local_38 + (long)local_1c + 0x19) = (char)local_18 + '\x01';
            if ('\x10' < *(char *)((long)local_38 + (long)local_1c + 0x19)) {
              return IHEVCD_INVALID_PARAMETER;
            }
            local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
            *(char *)((long)local_38 + (long)local_1c + 0x20) = (char)local_18;
            if (*(char *)((long)local_38 + (long)local_1c + 0x19) <
                *(char *)((long)local_38 + (long)local_1c + 0x20)) {
              return IHEVCD_INVALID_PARAMETER;
            }
            local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
            *(char *)((long)local_38 + (long)local_1c + 0x27) = (char)local_18;
          }
          if (local_10[0x1f] != 0) {
            lVar1 = *(long *)(local_10 + 0x80);
            if (*(char *)(lVar1 + 0x19 + (long)(*(char *)(lVar1 + 0xe) + -1)) !=
                *(char *)((long)local_38 + (long)((char)local_38[7] + -1) + 0x19)) {
              local_10[0x21] = 1;
              return 0x2a;
            }
            if (*(char *)(lVar1 + 0x20 + (long)(*(char *)(lVar1 + 0xe) + -1)) !=
                *(char *)((long)local_38 + (long)((char)local_38[7] + -1) + 0x20)) {
              local_10[0x21] = 1;
              return 0x2a;
            }
          }
          local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
          *(char *)(local_38 + 0x17) = (char)local_18 + '\x03';
          local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
          *(char *)((long)local_38 + 0x2f) = (char)local_18;
          local_290 = (int)(char)local_38[0x17] + (int)*(char *)((long)local_38 + 0x2f);
          local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
          *(char *)(local_38 + 0x18) = (char)local_18 + '\x02';
          local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
          *(char *)((long)local_38 + 0x31) = (char)local_18;
          *(char *)((long)local_38 + 0xdc1) =
               (char)local_38[0x18] + *(char *)((long)local_38 + 0x31);
          if (-1 < *(char *)((long)local_38 + 0xdc1)) {
            sps_max_sub_layers_minus1 = (int)*(char *)((long)local_38 + 0xdc1);
            if (4 < local_290) {
              local_290 = 5;
            }
            if (sps_max_sub_layers_minus1 <= local_290) {
              *(char *)(local_38 + 0x6e0) = (char)local_38[0x17] + *(char *)((long)local_38 + 0x2f);
              if ((((((char)local_38[0x17] < '\x03') || ((char)local_38[0x18] < '\x02')) ||
                   (*(char *)((long)local_38 + 0x31) < '\0')) ||
                  (((char)local_38[0x6e0] < *(char *)((long)local_38 + 0xdc1) ||
                   ((char)local_38[0x6e0] < '\x04')))) || ('\x06' < (char)local_38[0x6e0])) {
                return IHEVCD_INVALID_PARAMETER;
              }
              *(undefined1 *)(local_38 + 0x19) = 0;
              *(undefined1 *)((long)local_38 + 0x33) = 0;
              local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
              *(char *)(local_38 + 0x1a) = (char)local_18;
              local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
              *(char *)((long)local_38 + 0x35) = (char)local_18;
              local_18 = ihevcd_bits_get(ps_bitstrm_00,1);
              *(char *)(local_38 + 0x1b) = (char)local_18;
              if ((char)local_38[0x1b] == '\0') {
                memcpy(local_258,&DAT_002df3e0,0x50);
                memcpy(*(void **)(local_38 + 0x105c),gi2_flat_scale_mat_32x32,0xc0);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_240 * 2),
                       gi2_flat_scale_mat_32x32,0x300);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_228 * 2),
                       gi2_flat_scale_mat_32x32,0x600);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_21c * 2),
                       gi2_flat_scale_mat_32x32,0x600);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_210 * 2),
                       gi2_flat_scale_mat_32x32,0x800);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_20c * 2),
                       gi2_flat_scale_mat_32x32,0x800);
              }
              else {
                memcpy(&stack0xfffffffffffffdf8,&DAT_002df390,0x50);
                memcpy(*(void **)(local_38 + 0x105c),gi2_flat_scale_mat_32x32,0xc0);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)in_stack_fffffffffffffe10 * 2),
                       gi2_intra_default_scale_mat_8x8,0x80);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)in_stack_fffffffffffffe14 * 2),
                       gi2_intra_default_scale_mat_8x8,0x80);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_1e8 * 2),
                       gi2_intra_default_scale_mat_8x8,0x80);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_1e4 * 2),
                       gi2_inter_default_scale_mat_8x8,0x80);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_1e0 * 2),
                       gi2_inter_default_scale_mat_8x8,0x80);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_1dc * 2),
                       gi2_inter_default_scale_mat_8x8,0x80);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_1d8 * 2),
                       gi2_intra_default_scale_mat_16x16,0x200);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_1d4 * 2),
                       gi2_intra_default_scale_mat_16x16,0x200);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_1d0 * 2),
                       gi2_intra_default_scale_mat_16x16,0x200);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_1cc * 2),
                       gi2_inter_default_scale_mat_16x16,0x200);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_1c8 * 2),
                       gi2_inter_default_scale_mat_16x16,0x200);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_1c4 * 2),
                       gi2_inter_default_scale_mat_16x16,0x200);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_1c0 * 2),
                       gi2_intra_default_scale_mat_32x32,0x800);
                memcpy((void *)(*(long *)(local_38 + 0x105c) + (long)local_1bc * 2),
                       gi2_inter_default_scale_mat_32x32,0x800);
                local_18 = ihevcd_bits_get(ps_bitstrm_00,1);
                *(char *)((long)local_38 + 0x37) = (char)local_18;
                if (*(char *)((long)local_38 + 0x37) != '\0') {
                  ihevcd_scaling_list_data
                            ((codec_t *)
                             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                             in_stack_fffffffffffffe08->ai2_delta_poc);
                }
              }
              local_18 = ihevcd_bits_get(ps_bitstrm_00,1);
              *(char *)(local_38 + 0x1c) = (char)local_18;
              local_18 = ihevcd_bits_get(ps_bitstrm_00,1);
              *(char *)((long)local_38 + 0x39) = (char)local_18;
              local_18 = ihevcd_bits_get(ps_bitstrm_00,1);
              *(char *)(local_38 + 10) = (char)local_18;
              if ((char)local_38[10] != '\0') {
                local_18 = ihevcd_bits_get(ps_bitstrm_00,4);
                *(char *)((long)local_38 + 0x15) = (char)local_18 + '\x01';
                local_18 = ihevcd_bits_get(ps_bitstrm_00,4);
                *(char *)(local_38 + 0xb) = (char)local_18 + '\x01';
                local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
                *(char *)(local_38 + 0x19) = (char)local_18 + '\x03';
                local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
                *(char *)((long)local_38 + 0x33) = (char)local_18;
                local_18 = ihevcd_bits_get(ps_bitstrm_00,1);
                *(char *)(local_38 + 0x1d) = (char)local_18;
              }
              local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
              *(char *)(local_38 + 0x1e) = (char)local_18;
              if ((char)local_38[0x1e] < 'A') {
                if ((char)local_38[0x1e] < '\0') {
                  uVar2 = 0;
                }
                else {
                  uVar2 = (undefined1)local_38[0x1e];
                }
              }
              else {
                uVar2 = 0x40;
              }
              *(undefined1 *)(local_38 + 0x1e) = uVar2;
              for (local_1c = 0; local_1c < (char)local_38[0x1e]; local_1c = local_1c + 1) {
                ihevcd_short_term_ref_pic_set
                          ((bitstrm_t *)
                           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                           in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
              }
              local_18 = ihevcd_bits_get(ps_bitstrm_00,1);
              *(char *)((long)local_38 + 0x3d) = (char)local_18;
              if (*(char *)((long)local_38 + 0x3d) != '\0') {
                local_18 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4));
                *(char *)(local_38 + 0x1f) = (char)local_18;
                for (local_1c = 0; local_1c < (char)local_38[0x1f]; local_1c = local_1c + 1) {
                  local_18 = ihevcd_bits_get(ps_bitstrm_00,(int)*(char *)((long)local_38 + 0x17));
                  local_38[(long)local_1c + 0x20] = (short)local_18;
                  local_18 = ihevcd_bits_get(ps_bitstrm_00,1);
                  *(char *)((long)local_38 + (long)local_1c + 0x60) = (char)local_18;
                }
              }
              local_18 = ihevcd_bits_get(ps_bitstrm_00,1);
              *(char *)(local_38 + 0x38) = (char)local_18;
              local_18 = ihevcd_bits_get(ps_bitstrm_00,1);
              *(char *)((long)local_38 + 0x71) = (char)local_18;
              local_18 = ihevcd_bits_get(ps_bitstrm_00,1);
              *(char *)(local_38 + 0x39) = (char)local_18;
              if ((char)local_38[0x39] != '\0') {
                ihevcd_parse_vui_parameters
                          ((bitstrm_t *)CONCAT44(in_stack_fffffffffffffd84,iVar4),
                           (vui_t *)CONCAT44(iVar3,iVar5),sps_max_sub_layers_minus1);
              }
              ihevcd_bits_get(ps_bitstrm_00,1);
              iVar3 = (1 << (*(byte *)(local_38 + 0x6e0) & 0x1f)) + -1;
              local_38[0x6e1] =
                   (short)((*local_38 + iVar3) / (1 << (*(byte *)(local_38 + 0x6e0) & 0x1f)));
              local_38[0x6e2] =
                   (short)((local_38[1] + iVar3) / (1 << (*(byte *)(local_38 + 0x6e0) & 0x1f)));
              *(int *)(local_38 + 0x6e6) = (int)local_38[0x6e2] * (int)local_38[0x6e1];
              if (local_10[0x1c] == 0) {
                local_10[0x13f] = *(int *)(local_38 + 0x6e6);
              }
              local_38[0x6e3] = (short)((int)*local_38 / (1 << (*(byte *)(local_38 + 0x17) & 0x1f)))
              ;
              local_38[0x6e4] =
                   (short)((int)local_38[1] / (1 << (*(byte *)(local_38 + 0x17) & 0x1f)));
              if ((local_10[0x1f] != 0) &&
                 ((*local_10 != (int)*local_38 || (local_10[1] != (int)local_38[1])))) {
                local_10[0x21] = 1;
                return 0x2a;
              }
              if ((0x2100 < *local_38) || (0x22ce000 < (int)*local_38 * (int)local_38[1])) {
                return 0x11;
              }
              local_26c = 1;
              local_270 = 1;
              if (*(char *)((long)local_38 + 0xf) == '\x01') {
                local_26c = 2;
                local_270 = 2;
              }
              iVar3 = ((int)*local_38 - local_38[2] * local_26c) - local_38[3] * local_26c;
              iVar4 = ((int)local_38[1] - local_38[4] * local_270) - local_38[5] * local_270;
              if ((0 < iVar3) && (0 < iVar4)) {
                local_10[2] = iVar3;
                local_10[3] = iVar4;
                *local_10 = (int)*local_38;
                local_10[1] = (int)local_38[1];
                iVar3 = (*local_38 + 0xbf >> 5) << 5;
                if (local_10[5] < iVar3) {
                  local_10[5] = iVar3;
                }
                if (local_10[0xe] == 0) {
                  if (local_10[4] < local_10[2]) {
                    local_10[4] = local_10[2];
                  }
                }
                else if (local_10[4] < local_10[5]) {
                  local_10[4] = local_10[5];
                }
                local_10[0x1c] = 1;
                return local_14;
              }
              return IHEVCD_INVALID_PARAMETER;
            }
          }
          local_4 = IHEVCD_INVALID_PARAMETER;
        }
        else {
          local_4 = IHEVCD_UNSUPPORTED_BIT_DEPTH;
        }
      }
      else {
        local_4 = IHEVCD_UNSUPPORTED_BIT_DEPTH;
      }
    }
  }
  else {
    local_10[0xea] = 0xda;
    local_4 = 0xda;
  }
  return local_4;
}

Assistant:

IHEVCD_ERROR_T ihevcd_parse_sps(codec_t *ps_codec)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 value;

    WORD32 i;
    WORD32 vps_id;
    WORD32 sps_max_sub_layers;
    WORD32 sps_id;
    WORD32 sps_temporal_id_nesting_flag;
    sps_t *ps_sps;
    profile_tier_lvl_info_t s_ptl;
    bitstrm_t *ps_bitstrm = &ps_codec->s_parse.s_bitstrm;
    WORD32 ctb_log2_size_y = 0;


    BITS_PARSE("video_parameter_set_id", value, ps_bitstrm, 4);
    vps_id = value;
    vps_id = CLIP3(vps_id, 0, MAX_VPS_CNT - 1);

    BITS_PARSE("sps_max_sub_layers_minus1", value, ps_bitstrm, 3);
    sps_max_sub_layers = value + 1;
    sps_max_sub_layers = CLIP3(sps_max_sub_layers, 1, 7);

    BITS_PARSE("sps_temporal_id_nesting_flag", value, ps_bitstrm, 1);
    sps_temporal_id_nesting_flag = value;

    //profile_and_level( 1, sps_max_sub_layers_minus1 )
    ret = ihevcd_profile_tier_level(ps_bitstrm, &(s_ptl), 1,
                                    (sps_max_sub_layers - 1));

    UEV_PARSE("seq_parameter_set_id", value, ps_bitstrm);
    sps_id = value;

    if((sps_id >= MAX_SPS_CNT) || (sps_id < 0))
    {
        if(ps_codec->i4_sps_done)
            return IHEVCD_UNSUPPORTED_SPS_ID;
        else
            sps_id = 0;
    }


    ps_sps = (ps_codec->s_parse.ps_sps_base + MAX_SPS_CNT - 1);
    ps_sps->i1_sps_id = sps_id;
    ps_sps->i1_vps_id = vps_id;
    ps_sps->i1_sps_max_sub_layers = sps_max_sub_layers;
    ps_sps->i1_sps_temporal_id_nesting_flag = sps_temporal_id_nesting_flag;
    /* This is used only during initialization to get reorder count etc */
    ps_codec->i4_sps_id = sps_id;
    memcpy(&ps_sps->s_ptl, &s_ptl, sizeof(profile_tier_lvl_info_t));

    UEV_PARSE("chroma_format_idc", value, ps_bitstrm);
    ps_sps->i1_chroma_format_idc = value;

    if(ps_sps->i1_chroma_format_idc != CHROMA_FMT_IDC_YUV420)
    {
        ps_codec->s_parse.i4_error_code = IHEVCD_UNSUPPORTED_CHROMA_FMT_IDC;
        return (IHEVCD_ERROR_T)IHEVCD_UNSUPPORTED_CHROMA_FMT_IDC;
    }

    if(CHROMA_FMT_IDC_YUV444_PLANES == ps_sps->i1_chroma_format_idc)
    {
        BITS_PARSE("separate_colour_plane_flag", value, ps_bitstrm, 1);
        ps_sps->i1_separate_colour_plane_flag = value;
    }
    else
    {
        ps_sps->i1_separate_colour_plane_flag = 0;
    }

    UEV_PARSE("pic_width_in_luma_samples", value, ps_bitstrm);
    ps_sps->i2_pic_width_in_luma_samples = value;

    UEV_PARSE("pic_height_in_luma_samples", value, ps_bitstrm);
    ps_sps->i2_pic_height_in_luma_samples = value;

    if((0 >= ps_sps->i2_pic_width_in_luma_samples) || (0 >= ps_sps->i2_pic_height_in_luma_samples))
        return IHEVCD_INVALID_PARAMETER;

    /* i2_pic_width_in_luma_samples and i2_pic_height_in_luma_samples
       should be multiples of min_cb_size. Here these are aligned to 8,
       i.e. smallest CB size */
    ps_sps->i2_pic_width_in_luma_samples = ALIGN8(ps_sps->i2_pic_width_in_luma_samples);
    ps_sps->i2_pic_height_in_luma_samples = ALIGN8(ps_sps->i2_pic_height_in_luma_samples);

    BITS_PARSE("pic_cropping_flag", value, ps_bitstrm, 1);
    ps_sps->i1_pic_cropping_flag = value;

    if(ps_sps->i1_pic_cropping_flag)
    {

        UEV_PARSE("pic_crop_left_offset", value, ps_bitstrm);
        ps_sps->i2_pic_crop_left_offset = value;

        UEV_PARSE("pic_crop_right_offset", value, ps_bitstrm);
        ps_sps->i2_pic_crop_right_offset = value;

        UEV_PARSE("pic_crop_top_offset", value, ps_bitstrm);
        ps_sps->i2_pic_crop_top_offset = value;

        UEV_PARSE("pic_crop_bottom_offset", value, ps_bitstrm);
        ps_sps->i2_pic_crop_bottom_offset = value;
    }
    else
    {
        ps_sps->i2_pic_crop_left_offset = 0;
        ps_sps->i2_pic_crop_right_offset = 0;
        ps_sps->i2_pic_crop_top_offset = 0;
        ps_sps->i2_pic_crop_bottom_offset = 0;
    }


    UEV_PARSE("bit_depth_luma_minus8", value, ps_bitstrm);
    if(0 != value)
        return IHEVCD_UNSUPPORTED_BIT_DEPTH;

    UEV_PARSE("bit_depth_chroma_minus8", value, ps_bitstrm);
    if(0 != value)
        return IHEVCD_UNSUPPORTED_BIT_DEPTH;

    UEV_PARSE("log2_max_pic_order_cnt_lsb_minus4", value, ps_bitstrm);
    ps_sps->i1_log2_max_pic_order_cnt_lsb = value + 4;

    BITS_PARSE("sps_sub_layer_ordering_info_present_flag", value, ps_bitstrm, 1);
    ps_sps->i1_sps_sub_layer_ordering_info_present_flag = value;


    i = (ps_sps->i1_sps_sub_layer_ordering_info_present_flag ? 0 : (ps_sps->i1_sps_max_sub_layers - 1));
    for(; i < ps_sps->i1_sps_max_sub_layers; i++)
    {
        UEV_PARSE("max_dec_pic_buffering", value, ps_bitstrm);
        ps_sps->ai1_sps_max_dec_pic_buffering[i] = value + 1;

        if(ps_sps->ai1_sps_max_dec_pic_buffering[i] > MAX_DPB_SIZE)
        {
            return IHEVCD_INVALID_PARAMETER;
        }

        UEV_PARSE("num_reorder_pics", value, ps_bitstrm);
        ps_sps->ai1_sps_max_num_reorder_pics[i] = value;

        if(ps_sps->ai1_sps_max_num_reorder_pics[i] > ps_sps->ai1_sps_max_dec_pic_buffering[i])
        {
            return IHEVCD_INVALID_PARAMETER;
        }

        UEV_PARSE("max_latency_increase", value, ps_bitstrm);
        ps_sps->ai1_sps_max_latency_increase[i] = value;
    }

    /* Check if sps_max_dec_pic_buffering or sps_max_num_reorder_pics
       has changed */
    if(0 != ps_codec->i4_first_pic_done)
    {
        sps_t *ps_sps_old = ps_codec->s_parse.ps_sps;
        if(ps_sps_old->ai1_sps_max_dec_pic_buffering[ps_sps_old->i1_sps_max_sub_layers - 1] !=
                    ps_sps->ai1_sps_max_dec_pic_buffering[ps_sps->i1_sps_max_sub_layers - 1])
        {
            ps_codec->i4_reset_flag = 1;
            return (IHEVCD_ERROR_T)IVD_RES_CHANGED;
        }

        if(ps_sps_old->ai1_sps_max_num_reorder_pics[ps_sps_old->i1_sps_max_sub_layers - 1] !=
                    ps_sps->ai1_sps_max_num_reorder_pics[ps_sps->i1_sps_max_sub_layers - 1])
        {
            ps_codec->i4_reset_flag = 1;
            return (IHEVCD_ERROR_T)IVD_RES_CHANGED;
        }
    }

    UEV_PARSE("log2_min_coding_block_size_minus3", value, ps_bitstrm);
    ps_sps->i1_log2_min_coding_block_size = value + 3;

    UEV_PARSE("log2_diff_max_min_coding_block_size", value, ps_bitstrm);
    ps_sps->i1_log2_diff_max_min_coding_block_size = value;

    ctb_log2_size_y = ps_sps->i1_log2_min_coding_block_size + ps_sps->i1_log2_diff_max_min_coding_block_size;

    UEV_PARSE("log2_min_transform_block_size_minus2", value, ps_bitstrm);
    ps_sps->i1_log2_min_transform_block_size = value + 2;

    UEV_PARSE("log2_diff_max_min_transform_block_size", value, ps_bitstrm);
    ps_sps->i1_log2_diff_max_min_transform_block_size = value;

    ps_sps->i1_log2_max_transform_block_size = ps_sps->i1_log2_min_transform_block_size +
                    ps_sps->i1_log2_diff_max_min_transform_block_size;

    if ((ps_sps->i1_log2_max_transform_block_size < 0) ||
                    (ps_sps->i1_log2_max_transform_block_size > MIN(ctb_log2_size_y, 5)))
    {
        return IHEVCD_INVALID_PARAMETER;
    }

    ps_sps->i1_log2_ctb_size = ps_sps->i1_log2_min_coding_block_size +
                    ps_sps->i1_log2_diff_max_min_coding_block_size;

    if((ps_sps->i1_log2_min_coding_block_size < 3) ||
                    (ps_sps->i1_log2_min_transform_block_size < 2) ||
                    (ps_sps->i1_log2_diff_max_min_transform_block_size < 0) ||
                    (ps_sps->i1_log2_max_transform_block_size > ps_sps->i1_log2_ctb_size) ||
                    (ps_sps->i1_log2_ctb_size < 4) ||
                    (ps_sps->i1_log2_ctb_size > 6))
    {
        return IHEVCD_INVALID_PARAMETER;
    }

    ps_sps->i1_log2_min_pcm_coding_block_size = 0;
    ps_sps->i1_log2_diff_max_min_pcm_coding_block_size = 0;

    UEV_PARSE("max_transform_hierarchy_depth_inter", value, ps_bitstrm);
    ps_sps->i1_max_transform_hierarchy_depth_inter = value;

    UEV_PARSE("max_transform_hierarchy_depth_intra", value, ps_bitstrm);
    ps_sps->i1_max_transform_hierarchy_depth_intra = value;

    /* String has a d (enabled) in order to match with HM */
    BITS_PARSE("scaling_list_enabled_flag", value, ps_bitstrm, 1);
    ps_sps->i1_scaling_list_enable_flag = value;

    if(ps_sps->i1_scaling_list_enable_flag)
    {
        COPY_DEFAULT_SCALING_LIST(ps_sps->pi2_scaling_mat);
        BITS_PARSE("sps_scaling_list_data_present_flag", value, ps_bitstrm, 1);
        ps_sps->i1_sps_scaling_list_data_present_flag = value;

        if(ps_sps->i1_sps_scaling_list_data_present_flag)
            ihevcd_scaling_list_data(ps_codec, ps_sps->pi2_scaling_mat);
    }
    else
    {
        COPY_FLAT_SCALING_LIST(ps_sps->pi2_scaling_mat);
    }
    /* String is asymmetric_motion_partitions_enabled_flag instead of amp_enabled_flag in order to match with HM */
    BITS_PARSE("asymmetric_motion_partitions_enabled_flag", value, ps_bitstrm, 1);
    ps_sps->i1_amp_enabled_flag = value;

    BITS_PARSE("sample_adaptive_offset_enabled_flag", value, ps_bitstrm, 1);
    ps_sps->i1_sample_adaptive_offset_enabled_flag = value;

    BITS_PARSE("pcm_enabled_flag", value, ps_bitstrm, 1);
    ps_sps->i1_pcm_enabled_flag = value;

    if(ps_sps->i1_pcm_enabled_flag)
    {
        BITS_PARSE("pcm_sample_bit_depth_luma", value, ps_bitstrm, 4);
        ps_sps->i1_pcm_sample_bit_depth_luma = value + 1;

        BITS_PARSE("pcm_sample_bit_depth_chroma", value, ps_bitstrm, 4);
        ps_sps->i1_pcm_sample_bit_depth_chroma = value + 1;

        UEV_PARSE("log2_min_pcm_coding_block_size_minus3", value, ps_bitstrm);
        ps_sps->i1_log2_min_pcm_coding_block_size = value + 3;

        UEV_PARSE("log2_diff_max_min_pcm_coding_block_size", value, ps_bitstrm);
        ps_sps->i1_log2_diff_max_min_pcm_coding_block_size = value;
        BITS_PARSE("pcm_loop_filter_disable_flag", value, ps_bitstrm, 1);
        ps_sps->i1_pcm_loop_filter_disable_flag = value;

    }
    UEV_PARSE("num_short_term_ref_pic_sets", value, ps_bitstrm);
    ps_sps->i1_num_short_term_ref_pic_sets = value;

    ps_sps->i1_num_short_term_ref_pic_sets = CLIP3(ps_sps->i1_num_short_term_ref_pic_sets, 0, MAX_STREF_PICS_SPS);

    for(i = 0; i < ps_sps->i1_num_short_term_ref_pic_sets; i++)
        ihevcd_short_term_ref_pic_set(ps_bitstrm, &ps_sps->as_stref_picset[0], ps_sps->i1_num_short_term_ref_pic_sets, i, &ps_sps->as_stref_picset[i]);

    BITS_PARSE("long_term_ref_pics_present_flag", value, ps_bitstrm, 1);
    ps_sps->i1_long_term_ref_pics_present_flag = value;

    if(ps_sps->i1_long_term_ref_pics_present_flag)
    {
        UEV_PARSE("num_long_term_ref_pics_sps", value, ps_bitstrm);
        ps_sps->i1_num_long_term_ref_pics_sps = value;

        for(i = 0; i < ps_sps->i1_num_long_term_ref_pics_sps; i++)
        {
            BITS_PARSE("lt_ref_pic_poc_lsb_sps[ i ]", value, ps_bitstrm, ps_sps->i1_log2_max_pic_order_cnt_lsb);
            ps_sps->au2_lt_ref_pic_poc_lsb_sps[i] = value;

            BITS_PARSE("used_by_curr_pic_lt_sps_flag[ i ]", value, ps_bitstrm, 1);
            ps_sps->ai1_used_by_curr_pic_lt_sps_flag[i] = value;
        }
    }

    BITS_PARSE("sps_temporal_mvp_enable_flag", value, ps_bitstrm, 1);
    ps_sps->i1_sps_temporal_mvp_enable_flag = value;

    /* Print matches HM 8-2 */
    BITS_PARSE("sps_strong_intra_smoothing_enable_flag", value, ps_bitstrm, 1);
    ps_sps->i1_strong_intra_smoothing_enable_flag = value;

    BITS_PARSE("vui_parameters_present_flag", value, ps_bitstrm, 1);
    ps_sps->i1_vui_parameters_present_flag = value;

    if(ps_sps->i1_vui_parameters_present_flag)
        ihevcd_parse_vui_parameters(ps_bitstrm,
                                    &ps_sps->s_vui_parameters,
                                    ps_sps->i1_sps_max_sub_layers - 1);

    BITS_PARSE("sps_extension_flag", value, ps_bitstrm, 1);


    {
        WORD32 numerator;
        WORD32 ceil_offset;

        ceil_offset = (1 << ps_sps->i1_log2_ctb_size) - 1;
        numerator = ps_sps->i2_pic_width_in_luma_samples;

        ps_sps->i2_pic_wd_in_ctb = ((numerator + ceil_offset) /
                        (1 << ps_sps->i1_log2_ctb_size));

        numerator = ps_sps->i2_pic_height_in_luma_samples;
        ps_sps->i2_pic_ht_in_ctb = ((numerator + ceil_offset) /
                        (1 << ps_sps->i1_log2_ctb_size));

        ps_sps->i4_pic_size_in_ctb = ps_sps->i2_pic_ht_in_ctb *
                        ps_sps->i2_pic_wd_in_ctb;

        if(0 == ps_codec->i4_sps_done)
            ps_codec->s_parse.i4_next_ctb_indx = ps_sps->i4_pic_size_in_ctb;

        numerator = ps_sps->i2_pic_width_in_luma_samples;
        ps_sps->i2_pic_wd_in_min_cb = numerator  /
                        (1 << ps_sps->i1_log2_min_coding_block_size);

        numerator = ps_sps->i2_pic_height_in_luma_samples;
        ps_sps->i2_pic_ht_in_min_cb = numerator  /
                        (1 << ps_sps->i1_log2_min_coding_block_size);
    }
    if((0 != ps_codec->i4_first_pic_done) &&
                    ((ps_codec->i4_wd != ps_sps->i2_pic_width_in_luma_samples) ||
                    (ps_codec->i4_ht != ps_sps->i2_pic_height_in_luma_samples)))
    {
        ps_codec->i4_reset_flag = 1;
        return (IHEVCD_ERROR_T)IVD_RES_CHANGED;
    }

    if((ps_sps->i2_pic_width_in_luma_samples > MAX_WD) ||
                    ((ps_sps->i2_pic_width_in_luma_samples * ps_sps->i2_pic_height_in_luma_samples) >
                    (MAX_WD * MAX_HT)))
    {
        return (IHEVCD_ERROR_T)IVD_STREAM_WIDTH_HEIGHT_NOT_SUPPORTED;
    }

    /* Update display width and display height */
    {
        WORD32 disp_wd, disp_ht;
        WORD32 crop_unit_x, crop_unit_y;
        crop_unit_x = 1;
        crop_unit_y = 1;

        if(CHROMA_FMT_IDC_YUV420 == ps_sps->i1_chroma_format_idc)
        {
            crop_unit_x = 2;
            crop_unit_y = 2;
        }

        disp_wd = ps_sps->i2_pic_width_in_luma_samples;
        disp_wd -= ps_sps->i2_pic_crop_left_offset * crop_unit_x;
        disp_wd -= ps_sps->i2_pic_crop_right_offset * crop_unit_x;


        disp_ht = ps_sps->i2_pic_height_in_luma_samples;
        disp_ht -= ps_sps->i2_pic_crop_top_offset * crop_unit_y;
        disp_ht -= ps_sps->i2_pic_crop_bottom_offset * crop_unit_y;

        if((0 >= disp_wd) || (0 >= disp_ht))
            return IHEVCD_INVALID_PARAMETER;

        ps_codec->i4_disp_wd = disp_wd;
        ps_codec->i4_disp_ht = disp_ht;


        ps_codec->i4_wd = ps_sps->i2_pic_width_in_luma_samples;
        ps_codec->i4_ht = ps_sps->i2_pic_height_in_luma_samples;

        {
            WORD32 ref_strd;
            ref_strd = ALIGN32(ps_sps->i2_pic_width_in_luma_samples + PAD_WD);
            if(ps_codec->i4_strd < ref_strd)
            {
                ps_codec->i4_strd = ref_strd;
            }
        }

        if(0 == ps_codec->i4_share_disp_buf)
        {
            if(ps_codec->i4_disp_strd < ps_codec->i4_disp_wd)
            {
                ps_codec->i4_disp_strd = ps_codec->i4_disp_wd;
            }
        }
        else
        {
            if(ps_codec->i4_disp_strd < ps_codec->i4_strd)
            {
                ps_codec->i4_disp_strd = ps_codec->i4_strd;
            }
        }
    }

    ps_codec->i4_sps_done = 1;
    return ret;
}